

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

double __thiscall mat<3UL,_3UL>::cofactor(mat<3UL,_3UL> *this,size_t row,size_t col)

{
  long lVar1;
  bool bVar2;
  double ret;
  double dVar3;
  double dVar4;
  mat<2UL,_2UL> local_30;
  
  get_minor(&local_30,this,row,col);
  dVar3 = 0.0;
  lVar1 = -1;
  do {
    bVar2 = lVar1 == 0;
    dVar4 = (&local_30.rows[1].x)[bVar2];
    if (!bVar2) {
      dVar4 = -dVar4;
    }
    dVar3 = dVar3 + dVar4 * (&local_30.rows[0].x)[!bVar2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 1);
  if (((int)col + (int)row & 1U) != 0) {
    dVar3 = -dVar3;
  }
  return dVar3;
}

Assistant:

double cofactor(const size_t row, const size_t col) const
    {
        return get_minor(row, col).det() * ((row + col) % 2 ? -1 : 1);
    }